

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathPopString(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathObjectPtr *ppxVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlXPathObjectPtr pxVar5;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    xmlXPathErr((xmlXPathParserContextPtr)0x0,10);
  }
  else {
    iVar1 = ctxt->valueNr;
    if (0 < (long)iVar1) {
      uVar3 = iVar1 - 1;
      ctxt->valueNr = uVar3;
      ppxVar2 = ctxt->valueTab;
      if (iVar1 == 1) {
        pxVar5 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar5 = ppxVar2[(long)iVar1 + -2];
      }
      ctxt->value = pxVar5;
      pxVar5 = ppxVar2[uVar3];
      ppxVar2[uVar3] = (xmlXPathObjectPtr)0x0;
      if (pxVar5 != (xmlXPathObjectPtr)0x0) {
        pxVar4 = xmlXPathCastToString(pxVar5);
        if (pxVar4 == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        xmlXPathReleaseObject(ctxt->context,pxVar5);
        return pxVar4;
      }
    }
    xmlXPathErr(ctxt,10);
    ctxt->error = 10;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlXPathObjectPtr
xmlXPathValuePop(xmlXPathParserContextPtr ctxt)
{
    xmlXPathObjectPtr ret;

    if ((ctxt == NULL) || (ctxt->valueNr <= 0))
        return (NULL);

    ctxt->valueNr--;
    if (ctxt->valueNr > 0)
        ctxt->value = ctxt->valueTab[ctxt->valueNr - 1];
    else
        ctxt->value = NULL;
    ret = ctxt->valueTab[ctxt->valueNr];
    ctxt->valueTab[ctxt->valueNr] = NULL;
    return (ret);
}